

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_utilities.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* BamTools::Utilities::Split
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *source,string *delims)

{
  char *__dest;
  char *pcVar1;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __dest = (char *)operator_new__(source->_M_string_length + 1);
  strcpy(__dest,(source->_M_dataplus)._M_p);
  pcVar1 = strtok(__dest,(delims->_M_dataplus)._M_p);
  while (pcVar1 != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    pcVar1 = strtok((char *)0x0,(delims->_M_dataplus)._M_p);
  }
  operator_delete__(__dest);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Utilities::Split(const std::string& source, const std::string& delims)
{

    std::vector<std::string> fields;

    char* tok;
    char* cchars = new char[source.size() + 1];
    char* cstr = &cchars[0];
    std::strcpy(cstr, source.c_str());
    tok = std::strtok(cstr, delims.c_str());
    while (tok != NULL) {
        fields.push_back(tok);
        tok = std::strtok(NULL, delims.c_str());
    }

    delete[] cchars;

    return fields;
}